

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

void __thiscall helics::CommonCore::registerInterface(CommonCore *this,ActionMessage *command)

{
  string_view key;
  bool bVar1;
  action_t aVar2;
  uint uVar3;
  route_id rVar4;
  GlobalFederateId GVar5;
  GlobalBrokerId GVar6;
  pointer pBVar7;
  ActionMessage *in_RSI;
  long *in_RDI;
  string_view sVar8;
  __sv_type _Var9;
  __sv_type _Var10;
  ActionMessage add_1;
  ActionMessage add;
  FederateState *fed;
  HandleManager *loopHandleRef;
  InterfaceHandle handle;
  ActionMessage *in_stack_fffffffffffffce8;
  FederateState *in_stack_fffffffffffffcf0;
  ActionMessage *in_stack_fffffffffffffcf8;
  undefined8 in_stack_fffffffffffffd00;
  action_t startingAction;
  CommonCore *in_stack_fffffffffffffd08;
  ordered_guarded<helics::HandleManager,_std::shared_mutex> *in_stack_fffffffffffffd10;
  undefined4 in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd2c;
  undefined8 in_stack_fffffffffffffd30;
  ActionMessage *M;
  size_t sVar11;
  undefined1 in_stack_fffffffffffffd90 [16];
  unkbyte9 Var12;
  undefined4 in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda4;
  BaseType BVar13;
  undefined4 in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdac;
  string_view in_stack_fffffffffffffdb0;
  GlobalFederateId local_210;
  BaseType local_20c;
  GlobalFederateId in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffdfc;
  GlobalFederateId in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe04;
  GlobalFederateId local_1f4;
  BaseType local_1f0;
  GlobalFederateId local_1ec;
  ActionMessage local_1e8;
  BaseType local_12c;
  GlobalFederateId local_128;
  BaseType local_124;
  BaseType local_120;
  BaseType local_10c;
  BaseType local_108;
  GlobalFederateId local_104;
  ActionMessage local_100;
  BaseType local_44;
  FederateState *local_40;
  uint local_34;
  undefined4 in_stack_ffffffffffffffd4;
  CommonCore *this_00;
  
  startingAction = (action_t)((ulong)in_stack_fffffffffffffd00 >> 0x20);
  Var12 = in_stack_fffffffffffffd90._7_9_;
  GVar5.gid = (BaseType)((ulong)in_stack_fffffffffffffd30 >> 0x20);
  bVar1 = GlobalFederateId::operator==(&in_RSI->dest_id,(GlobalBrokerId)0x0);
  if (bVar1) {
    BVar13 = (in_RSI->source_handle).hid;
    this_00 = (CommonCore *)(in_RDI + 0xeb);
    gmlc::libguarded::ordered_guarded<helics::HandleManager,std::shared_mutex>::
    read<helics::CommonCore::registerInterface(helics::ActionMessage&)::__0>
              (in_stack_fffffffffffffd10,(anon_class_16_2_4c5d106a *)in_stack_fffffffffffffd08);
    aVar2 = ActionMessage::action(in_RSI);
    switch(aVar2) {
    case cmd_reg_pub:
    case cmd_reg_input:
    case cmd_reg_datasink:
      break;
    default:
      return;
    case cmd_reg_filter:
      if (in_RDI[0x15d] == 0) {
        generateFilterFederate(this_00);
      }
      std::atomic<helics::GlobalFederateId>::load
                ((atomic<helics::GlobalFederateId> *)(in_RDI + 0x15f),seq_cst);
      GlobalFederateId::operator_cast_to_GlobalBrokerId
                ((GlobalFederateId *)in_stack_fffffffffffffce8);
      sVar8 = ActionMessage::name((ActionMessage *)0x4acb8b);
      ActionMessage::getString_abi_cxx11_
                (in_stack_fffffffffffffcf8,(int)((ulong)in_stack_fffffffffffffcf0 >> 0x20));
      _Var9 = std::__cxx11::string::operator_cast_to_basic_string_view
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffcf0);
      ActionMessage::getString_abi_cxx11_
                (in_stack_fffffffffffffcf8,(int)((ulong)in_stack_fffffffffffffcf0 >> 0x20));
      _Var10 = std::__cxx11::string::operator_cast_to_basic_string_view
                         ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffcf0);
      sVar11 = _Var10._M_len;
      checkActionFlag<helics::ActionMessage,helics::FilterFlags>(in_RSI,clone_flag);
      key._M_len._4_4_ = in_stack_fffffffffffffda4;
      key._M_len._0_4_ = in_stack_fffffffffffffda0;
      key._M_str._0_4_ = in_stack_fffffffffffffda8;
      key._M_str._4_4_ = in_stack_fffffffffffffdac;
      FilterFederate::createFilter
                ((FilterFederate *)((unkuint9)Var12 >> 8),(GlobalBrokerId)(BaseType)(sVar11 >> 0x20)
                 ,(InterfaceHandle)(BaseType)sVar11,key,(string_view)_Var9,sVar8,SUB91(Var12,0));
      connectFilterTiming((CommonCore *)CONCAT44(in_stack_ffffffffffffffd4,BVar13));
      break;
    case cmd_reg_translator:
      if (in_RDI[0x129] == 0) {
        generateTranslatorFederate(this_00);
      }
      GVar5 = std::atomic<helics::GlobalFederateId>::load
                        ((atomic<helics::GlobalFederateId> *)(in_RDI + 299),seq_cst);
      GVar6 = GlobalFederateId::operator_cast_to_GlobalBrokerId
                        ((GlobalFederateId *)in_stack_fffffffffffffce8);
      BVar13 = (in_RSI->source_handle).hid;
      sVar8 = ActionMessage::name((ActionMessage *)0x4accce);
      sVar11 = sVar8._M_len;
      ActionMessage::getString_abi_cxx11_
                (in_stack_fffffffffffffcf8,(int)((ulong)in_stack_fffffffffffffcf0 >> 0x20));
      _Var9 = std::__cxx11::string::operator_cast_to_basic_string_view
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffcf0);
      ActionMessage::getString_abi_cxx11_
                (in_stack_fffffffffffffcf8,(int)((ulong)in_stack_fffffffffffffcf0 >> 0x20));
      _Var10 = std::__cxx11::string::operator_cast_to_basic_string_view
                         ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffcf0);
      sVar8._M_len._4_4_ = BVar13;
      sVar8._M_len._0_4_ = in_stack_fffffffffffffda0;
      sVar8._M_str._0_4_ = GVar5.gid;
      sVar8._M_str._4_4_ = GVar6.gid;
      TranslatorFederate::createTranslator
                ((TranslatorFederate *)_Var10._M_str,(GlobalBrokerId)(BaseType)(sVar11 >> 0x20),
                 (InterfaceHandle)(BaseType)sVar11,(string_view)_Var9,sVar8,
                 in_stack_fffffffffffffdb0);
      break;
    case cmd_reg_end:
      if (((*(byte *)((long)in_RDI + 0xdd) & 1) == 0) &&
         (bVar1 = checkActionFlag<helics::ActionMessage,helics::EndpointFlags>(in_RSI,targeted_flag)
         , !bVar1)) {
        pBVar7 = CLI::std::
                 unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                 ::operator->((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                               *)0x4ac73d);
        local_34 = (in_RSI->source_id).gid;
        uVar3 = (*pBVar7->_vptr_BaseTimeCoordinator[4])(pBVar7,(ulong)local_34);
        if ((uVar3 & 1) != 0) {
          local_44 = (in_RSI->source_id).gid;
          local_40 = getFederateCore((CommonCore *)
                                     CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                                     GVar5);
          if (local_40 != (FederateState *)0x0) {
            local_108 = *(BaseType *)((long)in_RDI + 0x14);
            GlobalFederateId::GlobalFederateId(&local_104,(GlobalBrokerId)local_108);
            local_10c = (in_RSI->source_id).gid;
            ActionMessage::ActionMessage
                      ((ActionMessage *)in_stack_fffffffffffffd08,startingAction,
                       (GlobalFederateId)(BaseType)((ulong)in_stack_fffffffffffffd10 >> 0x20),
                       (GlobalFederateId)(BaseType)in_stack_fffffffffffffd10);
            setActionFlag<helics::ActionMessage,helics::TimingFlags>(&local_100,parent_flag);
            FederateState::addAction(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
            pBVar7 = CLI::std::
                     unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                     ::operator->((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                                   *)0x4ac835);
            local_120 = (BaseType)
                        std::atomic::operator_cast_to_GlobalFederateId
                                  ((atomic<helics::GlobalFederateId> *)in_stack_fffffffffffffce8);
            (*pBVar7->_vptr_BaseTimeCoordinator[5])(pBVar7,(ulong)(uint)local_120);
            CLI::std::
            unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
            ::operator->((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                          *)0x4ac87a);
            local_124 = (BaseType)
                        std::atomic::operator_cast_to_GlobalFederateId
                                  ((atomic<helics::GlobalFederateId> *)in_stack_fffffffffffffce8);
            BaseTimeCoordinator::setAsChild
                      ((BaseTimeCoordinator *)in_stack_fffffffffffffd08,
                       (GlobalFederateId)(BaseType)((ulong)in_stack_fffffffffffffd10 >> 0x20));
            ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffffcf0);
          }
        }
        if ((*(byte *)((long)in_RDI + 0x211) & 1) == 0) {
          pBVar7 = CLI::std::
                   unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                   ::operator->((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                                 *)0x4ac908);
          local_12c = (BaseType)in_RDI[3];
          GlobalFederateId::GlobalFederateId(&local_128,(GlobalBrokerId)local_12c);
          uVar3 = (*pBVar7->_vptr_BaseTimeCoordinator[4])(pBVar7,(ulong)(uint)local_128.gid);
          if ((uVar3 & 1) != 0) {
            *(undefined1 *)((long)in_RDI + 0x211) = 1;
            local_1f0 = *(BaseType *)((long)in_RDI + 0x14);
            GlobalFederateId::GlobalFederateId(&local_1ec,(GlobalBrokerId)local_1f0);
            GlobalFederateId::GlobalFederateId(&local_1f4,(GlobalBrokerId)(BaseType)in_RDI[3]);
            M = &local_1e8;
            ActionMessage::ActionMessage
                      ((ActionMessage *)in_stack_fffffffffffffd08,startingAction,
                       (GlobalFederateId)(BaseType)((ulong)in_stack_fffffffffffffd10 >> 0x20),
                       (GlobalFederateId)(BaseType)in_stack_fffffffffffffd10);
            setActionFlag<helics::ActionMessage,helics::TimingFlags>(M,child_flag);
            GlobalFederateId::GlobalFederateId
                      ((GlobalFederateId *)&stack0xfffffffffffffe00,
                       (GlobalBrokerId)(BaseType)in_RDI[3]);
            rVar4 = getRoute(in_stack_fffffffffffffd08,
                             (GlobalFederateId)(BaseType)in_stack_fffffffffffffd10);
            GVar5.gid = (BaseType)((ulong)in_stack_fffffffffffffd10 >> 0x20);
            (**(code **)(*in_RDI + 0x358))(in_RDI,rVar4.rid,&local_1e8);
            pBVar7 = CLI::std::
                     unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                     ::operator->((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                                   *)0x4aca49);
            local_20c = (BaseType)in_RDI[3];
            GlobalFederateId::GlobalFederateId
                      ((GlobalFederateId *)&stack0xfffffffffffffdf8,(GlobalBrokerId)local_20c);
            (*pBVar7->_vptr_BaseTimeCoordinator[5])
                      (pBVar7,(ulong)(uint)in_stack_fffffffffffffdf8.gid);
            CLI::std::
            unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
            ::operator->((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                          *)0x4aca9c);
            GlobalFederateId::GlobalFederateId(&local_210,(GlobalBrokerId)(BaseType)in_RDI[3]);
            BaseTimeCoordinator::setAsParent((BaseTimeCoordinator *)in_stack_fffffffffffffd08,GVar5)
            ;
            ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffffcf0);
          }
        }
      }
    }
    bVar1 = SmallBuffer::empty(&in_RSI->payload);
    if (!bVar1) {
      (**(code **)(*in_RDI + 0x360))(in_RDI,0,in_RSI);
    }
  }
  else {
    routeMessage((CommonCore *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00.gid),
                 (ActionMessage *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8.gid))
    ;
  }
  return;
}

Assistant:

void CommonCore::registerInterface(ActionMessage& command)
{
    if (command.dest_id == parent_broker_id) {
        auto handle = command.source_handle;
        auto& loopHandleRef = loopHandles;
        handles.read([handle, &loopHandleRef](auto& hand) {
            auto ifc = hand.getHandleInfo(handle.baseValue());
            if (ifc != nullptr) {
                loopHandleRef.addHandleAtIndex(*ifc, handle.baseValue());
            }
        });

        switch (command.action()) {
            case CMD_REG_INPUT:
            case CMD_REG_PUB:
            case CMD_REG_DATASINK:
                break;
            case CMD_REG_ENDPOINT:
                if (globalTime) {
                    break;
                }
                if (checkActionFlag(command, targeted_flag)) {
                    break;
                }
                if (timeCoord->addDependency(command.source_id)) {
                    auto* fed = getFederateCore(command.source_id);
                    if (fed != nullptr) {
                        ActionMessage add(CMD_ADD_INTERDEPENDENCY,
                                          global_broker_id_local,
                                          command.source_id);

                        setActionFlag(add, parent_flag);
                        fed->addAction(add);
                        timeCoord->addDependent(fed->global_id);
                        timeCoord->setAsChild(fed->global_id);
                    }
                }

                if (!hasTimeDependency) {
                    if (timeCoord->addDependency(higher_broker_id)) {
                        hasTimeDependency = true;
                        ActionMessage add(CMD_ADD_INTERDEPENDENCY,
                                          global_broker_id_local,
                                          higher_broker_id);
                        setActionFlag(add, child_flag);

                        transmit(getRoute(higher_broker_id), add);

                        timeCoord->addDependent(higher_broker_id);
                        timeCoord->setAsParent(higher_broker_id);
                    }
                }
                break;
            case CMD_REG_FILTER:

                if (filterFed == nullptr) {
                    generateFilterFederate();
                }
                filterFed->createFilter(filterFedID.load(),
                                        command.source_handle,
                                        command.name(),
                                        command.getString(typeStringLoc),
                                        command.getString(typeOutStringLoc),
                                        checkActionFlag(command, clone_flag));
                connectFilterTiming();
                break;
            case CMD_REG_TRANSLATOR:

                if (translatorFed == nullptr) {
                    generateTranslatorFederate();
                }
                translatorFed->createTranslator(translatorFedID.load(),
                                                command.source_handle,
                                                command.name(),
                                                command.getString(typeStringLoc),
                                                command.getString(unitStringLoc));
                // connectFilterTiming();
                break;
            default:
                return;
        }
        if (!command.payload.empty()) {
            transmit(parent_route_id, std::move(command));
        }
    } else {
        routeMessage(std::move(command));
    }
}